

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QJsonDocument *o)

{
  long lVar1;
  bool bVar2;
  QDebug *this;
  QDebug *other;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QByteArray json;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff5f;
  QDebugStateSaver *in_stack_ffffffffffffff60;
  QCborValue *in_stack_ffffffffffffff68;
  QDebug *in_stack_ffffffffffffff70;
  JsonFormat format;
  Stream *this_00;
  char *in_stack_ffffffffffffffb8;
  char *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RDI,in_RSI);
  format = (JsonFormat)((ulong)in_RDI >> 0x20);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *
                     )0x48f683);
  if (bVar2) {
    t = &DAT_aaaaaaaaaaaaaaaa;
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator->
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               0x48f6f2);
    QJsonPrivate::Value::fromTrustedCbor(in_stack_ffffffffffffff68);
    QJsonValue::toJson((QJsonValue *)this_00,format);
    QJsonValue::~QJsonValue((QJsonValue *)0x48f72a);
    this = QDebug::nospace(in_RSI);
    other = QDebug::operator<<((QDebug *)this_00,t);
    QByteArray::constData((QByteArray *)0x48f75d);
    in_stack_ffffffffffffff60 = (QDebugStateSaver *)QDebug::operator<<((QDebug *)this_00,t);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
    QDebug::QDebug(this,other);
    QByteArray::~QByteArray((QByteArray *)0x48f7a3);
  }
  else {
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffffb8);
    QDebug::QDebug(in_stack_ffffffffffffff70,(QDebug *)in_stack_ffffffffffffff68);
  }
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonDocument &o)
{
    QDebugStateSaver saver(dbg);
    if (!o.d) {
        dbg << "QJsonDocument()";
        return dbg;
    }
    QByteArray json =
        QJsonPrivate::Value::fromTrustedCbor(o.d->value).toJson(QJsonValue::JsonFormat::Compact);
    dbg.nospace() << "QJsonDocument("
                  << json.constData() // print as utf-8 string without extra quotation marks
                  << ')';
    return dbg;
}